

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.cc
# Opt level: O0

int X509_digest(X509 *data,EVP_MD *type,uchar *md,uint *len)

{
  int iVar1;
  int ret;
  int der_len;
  uint8_t *der;
  uint *out_len_local;
  uint8_t *out_local;
  EVP_MD *md_local;
  X509 *x509_local;
  
  _ret = (uint8_t *)0x0;
  der = (uint8_t *)len;
  out_len_local = (uint *)md;
  out_local = (uint8_t *)type;
  md_local = (EVP_MD *)data;
  iVar1 = i2d_X509((X509 *)data,(uint8_t **)&ret);
  if (iVar1 < 0) {
    x509_local._4_4_ = 0;
  }
  else {
    iVar1 = EVP_Digest(_ret,(long)iVar1,(uchar *)out_len_local,(uint *)der,(EVP_MD *)out_local,
                       (ENGINE *)0x0);
    OPENSSL_free(_ret);
    x509_local._4_4_ = iVar1;
  }
  return x509_local._4_4_;
}

Assistant:

int X509_digest(const X509 *x509, const EVP_MD *md, uint8_t *out,
                unsigned *out_len) {
  uint8_t *der = NULL;
  // TODO(https://crbug.com/boringssl/407): This function is not const-correct.
  int der_len = i2d_X509((X509 *)x509, &der);
  if (der_len < 0) {
    return 0;
  }

  int ret = EVP_Digest(der, der_len, out, out_len, md, NULL);
  OPENSSL_free(der);
  return ret;
}